

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O1

bool __thiscall USDFParser::ParseConversation(USDFParser *this)

{
  FStrifeDialogueNode **ppFVar1;
  uint dlgindex;
  PClassActor *pPVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  char *key_00;
  bool block;
  FName key;
  int local_40;
  int local_3c;
  PClassActor *local_38;
  
  dlgindex = StrifeDialogues.Count;
  uVar5 = (ulong)StrifeDialogues.Count;
  local_40 = -1;
  local_38 = (PClassActor *)0x0;
LAB_00465e04:
  do {
    bVar3 = FScanner::CheckToken((FScanner *)this,0x7d);
    pPVar2 = local_38;
    if (bVar3) {
      if ((local_38 == (PClassActor *)0x0) && (local_40 == 0)) {
        bVar3 = false;
        FScanner::ScriptMessage((FScanner *)this,"No valid actor type defined in conversation.");
      }
      else {
        SetConversation(local_40,local_38,dlgindex);
        ppFVar1 = StrifeDialogues.Array;
        uVar4 = (ulong)StrifeDialogues.Count;
        bVar3 = true;
        if (dlgindex < StrifeDialogues.Count) {
          do {
            ppFVar1[uVar5]->SpeakerType = pPVar2;
            uVar5 = uVar5 + 1;
          } while (uVar4 != uVar5);
        }
      }
      return bVar3;
    }
    UDMFParserBase::ParseKey((UDMFParserBase *)&stack0xffffffffffffffc4,SUB81(this,0),(bool *)0x1);
    if (local_3c == 0x11f) goto LAB_00465eb1;
  } while ((local_3c != 4) ||
          (local_38 = CheckActorType(this,FName::NameData.NameArray[local_3c].Text),
          (this->super_UDMFParserBase).namespace_bits != 2));
  key_00 = FName::NameData.NameArray[local_3c].Text;
  goto LAB_00465ece;
LAB_00465eb1:
  if ((this->super_UDMFParserBase).namespace_bits == 1) {
    key_00 = FName::NameData.NameArray[local_3c].Text;
LAB_00465ece:
    local_40 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,key_00);
  }
  goto LAB_00465e04;
}

Assistant:

bool ParseConversation()
	{
		PClassActor *type = NULL;
		int dlgid = -1;
		unsigned int startpos = StrifeDialogues.Size();

		while (!sc.CheckToken('}'))
		{
			bool block = false;
			FName key = ParseKey(true, &block);
			if (!block)
			{
				switch(key)
				{
				case NAME_Actor:
					type = CheckActorType(key);
					if (namespace_bits == St)
					{
						dlgid = CheckInt(key);
					}
					break;

				case NAME_Id:
					if (namespace_bits == Zd)
					{
						dlgid = CheckInt(key);
					}
					break;
				}
			}
			else
			{
				switch(key)
				{
				case NAME_Page:
					if (!ParsePage()) return false;
					break;

				default:
					sc.UnGet();
					Skip();
				}
			}
		}
		if (type == NULL && dlgid == 0)
		{
			sc.ScriptMessage("No valid actor type defined in conversation.");
			return false;
		}
		SetConversation(dlgid, type, startpos);
		for(;startpos < StrifeDialogues.Size(); startpos++)
		{
			StrifeDialogues[startpos]->SpeakerType = type;
		}
		return true;
	}